

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

void __thiscall
btSoftColliders::CollideCL_RS::ProcessColObj
          (CollideCL_RS *this,btSoftBody *ps,btCollisionObjectWrapper *colObWrap)

{
  btCollisionShape *pbVar1;
  btDbvtAabbMm *this_00;
  btCollisionObject *this_01;
  float *pfVar2;
  btTransform *pbVar3;
  btCollisionObjectWrapper *in_RDX;
  long in_RSI;
  long in_RDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  btVector3 bVar4;
  btDbvtVolume volume;
  btVector3 maxs;
  btVector3 mins;
  undefined4 in_stack_ffffffffffffff08;
  float fVar5;
  btVector3 *this_02;
  btScalar local_b4;
  btScalar local_b0;
  btScalar local_ac;
  btVector3 local_a8;
  undefined8 local_98;
  undefined8 local_90;
  btDbvtNode *local_88;
  btDbvt *pbStack_80;
  ICollide *in_stack_ffffffffffffff88;
  btDbvtVolume *in_stack_ffffffffffffff90;
  btVector3 local_3c;
  btVector3 local_2c;
  btScalar local_1c;
  btCollisionObjectWrapper *local_18;
  
  *(long *)(in_RDI + 0x20) = in_RSI;
  *(btCollisionObjectWrapper **)(in_RDI + 0x28) = in_RDX;
  *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)(in_RSI + 0x244);
  local_18 = in_RDX;
  pbVar1 = btCollisionObjectWrapper::getCollisionShape
                     (*(btCollisionObjectWrapper **)(in_RDI + 0x28));
  (*pbVar1->_vptr_btCollisionShape[0xc])();
  fVar5 = extraout_XMM0_Da;
  pbVar1 = btCollisionObject::getCollisionShape(*(btCollisionObject **)(in_RDI + 0x20));
  (*pbVar1->_vptr_btCollisionShape[0xc])();
  *(float *)(in_RDI + 0x10) = fVar5 + extraout_XMM0_Da_00;
  this_00 = (btDbvtAabbMm *)(*(long *)(in_RDI + 0x20) + 0x194);
  this_01 = btCollisionObjectWrapper::getCollisionObject
                      (*(btCollisionObjectWrapper **)(in_RDI + 0x28));
  local_1c = btCollisionObject::getFriction(this_01);
  pfVar2 = btMin<float>((float *)this_00,&local_1c);
  *(float *)(in_RDI + 0x14) = *pfVar2;
  this_02 = &local_2c;
  btVector3::btVector3(this_02);
  btVector3::btVector3(&local_3c);
  btDbvtAabbMm::btDbvtAabbMm(this_00);
  pbVar1 = btCollisionObjectWrapper::getCollisionShape(local_18);
  pbVar3 = btCollisionObjectWrapper::getWorldTransform(local_18);
  (*pbVar1->_vptr_btCollisionShape[2])(pbVar1,pbVar3,this_02,&local_3c);
  btDbvtAabbMm::FromMM(this_02,(btVector3 *)pbVar1);
  local_ac = 1.0;
  local_b0 = 1.0;
  local_b4 = 1.0;
  btVector3::btVector3(&local_a8,&local_ac,&local_b0,&local_b4);
  bVar4 = ::operator*(this_02,(btScalar *)pbVar1);
  local_98 = bVar4.m_floats._0_8_;
  local_90 = bVar4.m_floats._8_8_;
  btDbvtAabbMm::Expand(this_00,(btVector3 *)CONCAT44(fVar5,in_stack_ffffffffffffff08));
  btDbvt::collideTV(pbStack_80,local_88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void		ProcessColObj(btSoftBody* ps,const btCollisionObjectWrapper* colObWrap)
		{
			psb			=	ps;
			m_colObjWrap			=	colObWrap;
			idt			=	ps->m_sst.isdt;
			m_margin		=	m_colObjWrap->getCollisionShape()->getMargin()+psb->getCollisionShape()->getMargin();
			///Bullet rigid body uses multiply instead of minimum to determine combined friction. Some customization would be useful.
			friction	=	btMin(psb->m_cfg.kDF,m_colObjWrap->getCollisionObject()->getFriction());
			btVector3			mins;
			btVector3			maxs;

			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume;
			colObWrap->getCollisionShape()->getAabb(colObWrap->getWorldTransform(),mins,maxs);
			volume=btDbvtVolume::FromMM(mins,maxs);
			volume.Expand(btVector3(1,1,1)*m_margin);
			ps->m_cdbvt.collideTV(ps->m_cdbvt.m_root,volume,*this);
		}